

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# verify.cpp
# Opt level: O1

TestReturnValue __thiscall
embree::MemoryMonitorTest::run(MemoryMonitorTest *this,VerifyApplication *state,bool silent)

{
  undefined8 *puVar1;
  vector<embree::IntersectMode,_std::allocator<embree::IntersectMode>_> *this_00;
  pointer *ppIVar2;
  VerifyApplication *pVVar3;
  pointer pcVar4;
  iterator iVar5;
  thread_func p_Var6;
  bool bVar7;
  VerifyApplication ***pppVVar8;
  RTCError code;
  uint uVar9;
  undefined8 *puVar10;
  RTCDevice userPtr;
  ulong uVar11;
  int sse2;
  TestReturnValue TVar12;
  uint sceneIndex;
  ulong uVar13;
  VerifyApplication *pVVar14;
  float fVar15;
  RTCDeviceRef device;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  string cfg;
  RegressionTask task2;
  RTCDeviceRef local_d8;
  RegressionTask local_d0;
  undefined8 *local_90;
  undefined8 local_88;
  undefined8 local_80;
  undefined8 uStack_78;
  undefined1 local_70 [32];
  BarrierSys local_50 [2];
  __atomic_base<unsigned_long> local_40;
  
  pppVVar8 = (VerifyApplication ***)&local_d0.state;
  pcVar4 = (state->super_Application).rtcore._M_dataplus._M_p;
  local_d0._0_8_ = pppVVar8;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_d0,pcVar4,pcVar4 + (state->super_Application).rtcore._M_string_length)
  ;
  std::__cxx11::string::append((char *)&local_d0);
  stringOfISA_abi_cxx11_((string *)local_70,(embree *)(ulong)(uint)(this->super_Test).sse2,sse2);
  pVVar3 = (VerifyApplication *)
           ((long)&((RefCount *)local_70._8_8_)->_vptr_RefCount + (long)local_d0.test);
  pVVar14 = (VerifyApplication *)0xf;
  if ((VerifyApplication ***)local_d0._0_8_ != pppVVar8) {
    pVVar14 = local_d0.state;
  }
  if (pVVar14 < pVVar3) {
    pVVar14 = (VerifyApplication *)0xf;
    if ((undefined1 *)local_70._0_8_ != local_70 + 0x10) {
      pVVar14 = (VerifyApplication *)local_70._16_8_;
    }
    if (pVVar3 <= pVVar14) {
      puVar10 = (undefined8 *)
                std::__cxx11::string::replace((ulong)local_70,0,(char *)0x0,local_d0._0_8_);
      goto LAB_00155d59;
    }
  }
  puVar10 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_d0,local_70._0_8_);
LAB_00155d59:
  local_90 = &local_80;
  puVar1 = puVar10 + 2;
  if ((undefined8 *)*puVar10 == puVar1) {
    local_80 = *puVar1;
    uStack_78 = puVar10[3];
  }
  else {
    local_80 = *puVar1;
    local_90 = (undefined8 *)*puVar10;
  }
  local_88 = puVar10[1];
  *puVar10 = puVar1;
  puVar10[1] = 0;
  *(undefined1 *)puVar1 = 0;
  if ((undefined1 *)local_70._0_8_ != local_70 + 0x10) {
    operator_delete((void *)local_70._0_8_);
  }
  if ((VerifyApplication ***)local_d0._0_8_ != pppVVar8) {
    operator_delete((void *)local_d0._0_8_);
  }
  userPtr = (RTCDevice)rtcNewDevice(local_90);
  local_d8.device = userPtr;
  code = rtcGetDeviceError();
  errorHandler(userPtr,code,(char *)0x0);
  this_00 = &this->intersectModes;
  local_d0.sceneIndex = 1;
  iVar5._M_current =
       (this->intersectModes).
       super__Vector_base<embree::IntersectMode,_std::allocator<embree::IntersectMode>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar5._M_current ==
      (this->intersectModes).
      super__Vector_base<embree::IntersectMode,_std::allocator<embree::IntersectMode>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<embree::IntersectMode,_std::allocator<embree::IntersectMode>_>::
    _M_realloc_insert<embree::IntersectMode>(this_00,iVar5,&local_d0.sceneIndex);
  }
  else {
    *iVar5._M_current = MODE_INTERSECT1;
    ppIVar2 = &(this->intersectModes).
               super__Vector_base<embree::IntersectMode,_std::allocator<embree::IntersectMode>_>.
               _M_impl.super__Vector_impl_data._M_finish;
    *ppIVar2 = *ppIVar2 + 1;
  }
  local_d0.sceneIndex = 2;
  iVar5._M_current =
       (this->intersectModes).
       super__Vector_base<embree::IntersectMode,_std::allocator<embree::IntersectMode>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar5._M_current ==
      (this->intersectModes).
      super__Vector_base<embree::IntersectMode,_std::allocator<embree::IntersectMode>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<embree::IntersectMode,_std::allocator<embree::IntersectMode>_>::
    _M_realloc_insert<embree::IntersectMode>(this_00,iVar5,&local_d0.sceneIndex);
  }
  else {
    *iVar5._M_current = MODE_INTERSECT4;
    ppIVar2 = &(this->intersectModes).
               super__Vector_base<embree::IntersectMode,_std::allocator<embree::IntersectMode>_>.
               _M_impl.super__Vector_impl_data._M_finish;
    *ppIVar2 = *ppIVar2 + 1;
  }
  local_d0.sceneIndex = 3;
  iVar5._M_current =
       (this->intersectModes).
       super__Vector_base<embree::IntersectMode,_std::allocator<embree::IntersectMode>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar5._M_current ==
      (this->intersectModes).
      super__Vector_base<embree::IntersectMode,_std::allocator<embree::IntersectMode>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<embree::IntersectMode,_std::allocator<embree::IntersectMode>_>::
    _M_realloc_insert<embree::IntersectMode>(this_00,iVar5,&local_d0.sceneIndex);
  }
  else {
    *iVar5._M_current = MODE_INTERSECT8;
    ppIVar2 = &(this->intersectModes).
               super__Vector_base<embree::IntersectMode,_std::allocator<embree::IntersectMode>_>.
               _M_impl.super__Vector_impl_data._M_finish;
    *ppIVar2 = *ppIVar2 + 1;
  }
  local_d0.sceneIndex = 4;
  iVar5._M_current =
       (this->intersectModes).
       super__Vector_base<embree::IntersectMode,_std::allocator<embree::IntersectMode>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar5._M_current ==
      (this->intersectModes).
      super__Vector_base<embree::IntersectMode,_std::allocator<embree::IntersectMode>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<embree::IntersectMode,_std::allocator<embree::IntersectMode>_>::
    _M_realloc_insert<embree::IntersectMode>(this_00,iVar5,&local_d0.sceneIndex);
  }
  else {
    *iVar5._M_current = MODE_INTERSECT16;
    ppIVar2 = &(this->intersectModes).
               super__Vector_base<embree::IntersectMode,_std::allocator<embree::IntersectMode>_>.
               _M_impl.super__Vector_impl_data._M_finish;
    *ppIVar2 = *ppIVar2 + 1;
  }
  uVar13 = 0;
  rtcSetDeviceMemoryMonitorFunction(local_d8.device,monitorMemoryFunction,0);
  do {
    sceneIndex = (uint)uVar13;
    fVar15 = this->intensity * state->intensity;
    uVar11 = (ulong)fVar15;
    if (((long)(fVar15 - 9.223372e+18) & (long)uVar11 >> 0x3f | uVar11) <= uVar13) {
      rtcSetDeviceMemoryMonitorFunction(local_d8.device,0,0);
      TVar12 = PASSED;
      AssertNoError(local_d8.device);
      goto LAB_001561d7;
    }
    monitorMemoryBreak = 0xffffffffffffffff;
    LOCK();
    monitorMemoryBytesUsed = 0;
    UNLOCK();
    LOCK();
    monitorMemoryInvokations = 0;
    UNLOCK();
    LOCK();
    monitorMemoryBreakExecuted = 0;
    UNLOCK();
    monitorProgressBreak = 0xffffffffffffffff;
    LOCK();
    monitorProgressInvokations = 0;
    UNLOCK();
    LOCK();
    monitorProgressBreakExecuted = 0;
    UNLOCK();
    RegressionTask::RegressionTask(&local_d0,&this->super_Test,sceneIndex,1,0,true);
    p_Var6 = this->func;
    puVar10 = (undefined8 *)operator_new(0x28);
    *puVar10 = 0;
    puVar10[1] = state;
    puVar10[2] = &local_d8;
    puVar10[3] = this_00;
    puVar10[4] = &local_d0;
    (*p_Var6)(puVar10);
    if (monitorMemoryBytesUsed == 0) {
      uVar9 = (this->super_Test).sampler.s * 0x19660d + 0x3c6ef35f;
      (this->super_Test).sampler.s = uVar9;
      fVar15 = (float)(uVar9 >> 1) * 4.656613e-10 * (float)monitorMemoryInvokations;
      uVar11 = (ulong)fVar15;
      monitorMemoryBreak = (long)(fVar15 - 9.223372e+18) & (long)uVar11 >> 0x3f | uVar11;
      LOCK();
      monitorMemoryBytesUsed = 0;
      UNLOCK();
      LOCK();
      monitorMemoryInvokations = 0;
      UNLOCK();
      LOCK();
      monitorMemoryBreakExecuted = 0;
      UNLOCK();
      uVar9 = (this->super_Test).sampler.s * 0x19660d + 0x3c6ef35f;
      (this->super_Test).sampler.s = uVar9;
      fVar15 = ((float)monitorProgressInvokations + (float)monitorProgressInvokations) *
               (float)(uVar9 >> 1) * 4.656613e-10;
      uVar11 = (ulong)fVar15;
      monitorProgressBreak = (long)(fVar15 - 9.223372e+18) & (long)uVar11 >> 0x3f | uVar11;
      LOCK();
      monitorProgressInvokations = 0;
      UNLOCK();
      LOCK();
      monitorProgressBreakExecuted = 0;
      UNLOCK();
      RegressionTask::RegressionTask
                ((RegressionTask *)local_70,&this->super_Test,sceneIndex,1,0,true);
      p_Var6 = this->func;
      puVar10 = (undefined8 *)operator_new(0x28);
      *puVar10 = 0;
      puVar10[1] = state;
      puVar10[2] = &local_d8;
      puVar10[3] = this_00;
      puVar10[4] = local_70;
      (*p_Var6)(puVar10);
      if ((((monitorMemoryBytesUsed == 0) &&
           ((monitorMemoryBreakExecuted == 0 || (local_40._M_i == 1)))) &&
          ((monitorProgressBreakExecuted == 0 || (local_40._M_i == 1)))) &&
         (((monitorMemoryBreakExecuted != 0 || (monitorProgressBreakExecuted != 0)) ||
          (local_40._M_i == 0)))) {
        uVar13 = (ulong)(sceneIndex + 1);
        bVar7 = true;
      }
      else {
        bVar7 = false;
      }
      BarrierSys::~BarrierSys(local_50);
      if ((long *)local_70._24_8_ != (long *)0x0) {
        (**(code **)(*(long *)local_70._24_8_ + 0x18))();
      }
    }
    else {
      bVar7 = false;
    }
    BarrierSys::~BarrierSys(&local_d0.barrier);
    if (local_d0.scene.ptr != (VerifyScene *)0x0) {
      (*((local_d0.scene.ptr)->super_RefCount)._vptr_RefCount[3])();
    }
  } while (bVar7);
  TVar12 = FAILED;
LAB_001561d7:
  RTCDeviceRef::~RTCDeviceRef(&local_d8);
  if (local_90 != &local_80) {
    operator_delete(local_90);
  }
  return TVar12;
}

Assistant:

VerifyApplication::TestReturnValue run(VerifyApplication* state, bool silent)
    {
      std::string cfg = state->rtcore + ",isa="+stringOfISA(isa);
      RTCDeviceRef device = rtcNewDevice(cfg.c_str());
      errorHandler(nullptr,rtcGetDeviceError(device));
      
      /* only test supported intersect modes */
      intersectModes.push_back(MODE_INTERSECT1);
      intersectModes.push_back(MODE_INTERSECT4);
      intersectModes.push_back(MODE_INTERSECT8);
      intersectModes.push_back(MODE_INTERSECT16);
      
      rtcSetDeviceMemoryMonitorFunction(device,monitorMemoryFunction,nullptr);
      
      unsigned int sceneIndex = 0;
      while (sceneIndex < size_t(intensity*state->intensity)) 
      {
        monitorMemoryBreak = std::numeric_limits<size_t>::max();
        monitorMemoryBytesUsed = 0;
        monitorMemoryInvokations = 0;
        monitorMemoryBreakExecuted = 0;
        monitorProgressBreak = std::numeric_limits<size_t>::max();
        monitorProgressInvokations = 0;
        monitorProgressBreakExecuted = 0;
        RegressionTask task1(this,sceneIndex,1,0,true);
        func(new ThreadRegressionTask(0,0,state,device,intersectModes,&task1));
        if (monitorMemoryBytesUsed) 
          return VerifyApplication::FAILED;

        monitorMemoryBreak = size_t(float(monitorMemoryInvokations) * random_float());
        monitorMemoryBytesUsed = 0;
        monitorMemoryInvokations = 0;
        monitorMemoryBreakExecuted = 0;
        monitorProgressBreak = size_t(float(monitorProgressInvokations) * 2.0f * random_float());
        monitorProgressInvokations = 0;
        monitorProgressBreakExecuted = 0;
        RegressionTask task2(this,sceneIndex,1,0,true);
        func(new ThreadRegressionTask(0,0,state,device,intersectModes,&task2));
        if (monitorMemoryBytesUsed) 
          return VerifyApplication::FAILED;
        if (monitorMemoryBreakExecuted && task2.errorCounter != 1) 
          return VerifyApplication::FAILED;
        if (monitorProgressBreakExecuted && task2.errorCounter != 1) 
          return VerifyApplication::FAILED;
        if (!monitorMemoryBreakExecuted && !monitorProgressBreakExecuted && task2.errorCounter != 0) 
          return VerifyApplication::FAILED;
        sceneIndex++;
      }
      rtcSetDeviceMemoryMonitorFunction(device,nullptr,nullptr);
      AssertNoError(device);
      return VerifyApplication::PASSED;
    }